

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

CK_OBJECT_HANDLE __thiscall
HandleManager::addTokenObject
          (HandleManager *this,CK_SLOT_ID slotID,bool isPrivate,CK_VOID_PTR object)

{
  bool bVar1;
  bool bVar2;
  iterator this_00;
  pointer ppVar3;
  pointer ppVar4;
  mapped_type *pmVar5;
  CK_VOID_PTR in_RCX;
  byte in_DL;
  CK_SLOT_ID in_RSI;
  key_type *in_RDI;
  Handle h;
  iterator hit;
  iterator oit;
  MutexLocker lock;
  Mutex *in_stack_ffffffffffffff08;
  _func_int **pp_Var6;
  MutexLocker *in_stack_ffffffffffffff10;
  iterator in_stack_ffffffffffffff18;
  Handle local_a8;
  undefined4 local_7c;
  _Base_ptr local_78;
  _Base_ptr local_70;
  _Self local_68;
  _Self local_60;
  _Self local_58 [3];
  _Self local_40 [3];
  CK_VOID_PTR local_28;
  byte local_19;
  CK_SLOT_ID local_18;
  key_type local_8;
  
  local_19 = in_DL & 1;
  local_28 = in_RCX;
  local_18 = in_RSI;
  MutexLocker::MutexLocker(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  this_00 = std::
            map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
            ::find((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                    *)in_stack_ffffffffffffff08,(key_type *)0x1cc5be);
  local_40[0]._M_node = this_00._M_node;
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
       ::end((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
              *)in_stack_ffffffffffffff08);
  bVar1 = std::operator!=(local_40,local_58);
  if (bVar1) {
    std::_Rb_tree_iterator<std::pair<void_*const,_unsigned_long>_>::operator->
              ((_Rb_tree_iterator<std::pair<void_*const,_unsigned_long>_> *)0x1cc621);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
         ::find((map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
                 *)in_stack_ffffffffffffff08,(key_type *)0x1cc632);
    local_68._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
         ::end((map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
                *)in_stack_ffffffffffffff08);
    bVar2 = std::operator==(&local_60,&local_68);
    bVar1 = true;
    if (!bVar2) {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_> *)0x1cc68b);
      bVar1 = true;
      if ((ppVar3->second).kind == 2) {
        ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_>::operator->
                           ((_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_> *)0x1cc6b9);
        bVar1 = local_18 != (ppVar3->second).slotID;
      }
    }
    if (bVar1) {
      local_70 = local_40[0]._M_node;
      local_78 = (_Base_ptr)
                 std::
                 map<void*,unsigned_long,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>
                 ::erase_abi_cxx11_((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                     *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
      local_8 = (key_type)0x0;
    }
    else {
      ppVar4 = std::_Rb_tree_iterator<std::pair<void_*const,_unsigned_long>_>::operator->
                         ((_Rb_tree_iterator<std::pair<void_*const,_unsigned_long>_> *)0x1cc75c);
      local_8 = (key_type)ppVar4->second;
    }
  }
  else {
    Handle::Handle(&local_a8,2,local_18);
    local_a8.isPrivate = (bool)(local_19 & 1);
    local_a8.object = local_28;
    in_RDI[0xe] = (key_type)((long)in_RDI[0xe] + 1);
    pmVar5 = std::
             map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
             ::operator[]((map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
                           *)this_00._M_node,(key_type *)in_RDI);
    pmVar5->isPrivate = local_a8.isPrivate;
    pmVar5->hSession = local_a8.hSession;
    pmVar5->object = local_a8.object;
    pmVar5->kind = local_a8.kind;
    pmVar5->slotID = local_a8.slotID;
    pp_Var6 = (_func_int **)in_RDI[0xe];
    in_stack_ffffffffffffff10 =
         (MutexLocker *)
         std::
         map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
         ::operator[]((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                       *)this_00._M_node,in_RDI);
    in_stack_ffffffffffffff10->_vptr_MutexLocker = pp_Var6;
    local_8 = in_RDI[0xe];
  }
  local_7c = 1;
  MutexLocker::~MutexLocker(in_stack_ffffffffffffff10);
  return (CK_OBJECT_HANDLE)local_8;
}

Assistant:

CK_OBJECT_HANDLE HandleManager::addTokenObject(CK_SLOT_ID slotID, bool isPrivate, CK_VOID_PTR object)
{
	MutexLocker lock(handlesMutex);

	// Return existing handle when the object has already been registered.
	std::map< CK_VOID_PTR, CK_ULONG>::iterator oit = objects.find(object);
	if (oit != objects.end()) {
		std::map< CK_ULONG, Handle>::iterator hit = handles.find(oit->second);
		if (hit == handles.end() || CKH_OBJECT != hit->second.kind || slotID != hit->second.slotID) {
			objects.erase(oit);
			return CK_INVALID_HANDLE;
		} else
			return oit->second;
	}

	// Token objects are not associated with a specific session.
	Handle h( CKH_OBJECT, slotID );
	h.isPrivate = isPrivate;
	h.object = object;
	handles[++handleCounter] = h;
	objects[object] = handleCounter;
	return (CK_OBJECT_HANDLE)handleCounter;
}